

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attached_database.cpp
# Opt level: O1

void __thiscall
duckdb::AttachedDatabase::AttachedDatabase
          (AttachedDatabase *this,DatabaseInstance *db,AttachedDatabaseType type)

{
  _Head_base<0UL,_duckdb::StorageManager_*,_false> _Var1;
  _Head_base<0UL,_duckdb::Catalog_*,_false> _Var2;
  _Head_base<0UL,_duckdb::TransactionManager_*,_false> _Var3;
  _Head_base<0UL,_duckdb::StorageManager_*,_false> this_00;
  _Head_base<0UL,_duckdb::Catalog_*,_false> this_01;
  _Head_base<0UL,_duckdb::TransactionManager_*,_false> this_02;
  char *pcVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  string local_70;
  string local_50;
  
  pcVar4 = "temp";
  if (type == SYSTEM_DATABASE) {
    pcVar4 = "system";
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,pcVar4,pcVar4 + (ulong)(type == SYSTEM_DATABASE) * 2 + 4);
  CatalogEntry::CatalogEntry(&this->super_CatalogEntry,DATABASE_ENTRY,&local_50,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  (this->super_CatalogEntry)._vptr_CatalogEntry = (_func_int **)&PTR__AttachedDatabase_024a62f8;
  this->db = db;
  (this->storage).
  super_unique_ptr<duckdb::StorageManager,_std::default_delete<duckdb::StorageManager>_>._M_t.
  super___uniq_ptr_impl<duckdb::StorageManager,_std::default_delete<duckdb::StorageManager>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::StorageManager_*,_std::default_delete<duckdb::StorageManager>_>.
  super__Head_base<0UL,_duckdb::StorageManager_*,_false>._M_head_impl = (StorageManager *)0x0;
  (this->catalog).super_unique_ptr<duckdb::Catalog,_std::default_delete<duckdb::Catalog>_>._M_t.
  super___uniq_ptr_impl<duckdb::Catalog,_std::default_delete<duckdb::Catalog>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Catalog_*,_std::default_delete<duckdb::Catalog>_>.
  super__Head_base<0UL,_duckdb::Catalog_*,_false>._M_head_impl = (Catalog *)0x0;
  (this->transaction_manager).
  super_unique_ptr<duckdb::TransactionManager,_std::default_delete<duckdb::TransactionManager>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::TransactionManager,_std::default_delete<duckdb::TransactionManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::TransactionManager_*,_std::default_delete<duckdb::TransactionManager>_>
  .super__Head_base<0UL,_duckdb::TransactionManager_*,_false>._M_head_impl =
       (TransactionManager *)0x0;
  this->type = type;
  (this->parent_catalog).ptr = (Catalog *)0x0;
  (this->storage_extension).ptr = (StorageExtension *)0x0;
  this->is_initial_database = false;
  this->is_closed = false;
  if (type == TEMP_DATABASE) {
    local_90 = &local_80;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,":memory:","");
    this_00._M_head_impl = (StorageManager *)operator_new(0x58);
    if (local_90 == &local_80) {
      local_70.field_2._8_8_ = local_80._8_8_;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    }
    else {
      local_70._M_dataplus._M_p = (pointer)local_90;
    }
    local_70._M_string_length = local_88;
    local_88 = 0;
    local_80._M_local_buf[0] = '\0';
    local_90 = &local_80;
    SingleFileStorageManager::SingleFileStorageManager
              ((SingleFileStorageManager *)this_00._M_head_impl,this,&local_70,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    _Var1._M_head_impl =
         (this->storage).
         super_unique_ptr<duckdb::StorageManager,_std::default_delete<duckdb::StorageManager>_>._M_t
         .
         super___uniq_ptr_impl<duckdb::StorageManager,_std::default_delete<duckdb::StorageManager>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::StorageManager_*,_std::default_delete<duckdb::StorageManager>_>
         .super__Head_base<0UL,_duckdb::StorageManager_*,_false>._M_head_impl;
    (this->storage).
    super_unique_ptr<duckdb::StorageManager,_std::default_delete<duckdb::StorageManager>_>._M_t.
    super___uniq_ptr_impl<duckdb::StorageManager,_std::default_delete<duckdb::StorageManager>_>._M_t
    .super__Tuple_impl<0UL,_duckdb::StorageManager_*,_std::default_delete<duckdb::StorageManager>_>.
    super__Head_base<0UL,_duckdb::StorageManager_*,_false>._M_head_impl = this_00._M_head_impl;
    if (_Var1._M_head_impl != (StorageManager *)0x0) {
      (**(code **)((long)(_Var1._M_head_impl)->_vptr_StorageManager + 8))();
    }
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
  }
  this_01._M_head_impl = (Catalog *)operator_new(0x88);
  DuckCatalog::DuckCatalog((DuckCatalog *)this_01._M_head_impl,this);
  _Var2._M_head_impl =
       (this->catalog).super_unique_ptr<duckdb::Catalog,_std::default_delete<duckdb::Catalog>_>._M_t
       .super___uniq_ptr_impl<duckdb::Catalog,_std::default_delete<duckdb::Catalog>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Catalog_*,_std::default_delete<duckdb::Catalog>_>.
       super__Head_base<0UL,_duckdb::Catalog_*,_false>._M_head_impl;
  (this->catalog).super_unique_ptr<duckdb::Catalog,_std::default_delete<duckdb::Catalog>_>._M_t.
  super___uniq_ptr_impl<duckdb::Catalog,_std::default_delete<duckdb::Catalog>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Catalog_*,_std::default_delete<duckdb::Catalog>_>.
  super__Head_base<0UL,_duckdb::Catalog_*,_false>._M_head_impl = this_01._M_head_impl;
  if (_Var2._M_head_impl != (Catalog *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_Catalog + 8))();
  }
  this_02._M_head_impl = (TransactionManager *)operator_new(0x1b8);
  DuckTransactionManager::DuckTransactionManager
            ((DuckTransactionManager *)this_02._M_head_impl,this);
  _Var3._M_head_impl =
       (this->transaction_manager).
       super_unique_ptr<duckdb::TransactionManager,_std::default_delete<duckdb::TransactionManager>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::TransactionManager,_std::default_delete<duckdb::TransactionManager>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::TransactionManager_*,_std::default_delete<duckdb::TransactionManager>_>
       .super__Head_base<0UL,_duckdb::TransactionManager_*,_false>._M_head_impl;
  (this->transaction_manager).
  super_unique_ptr<duckdb::TransactionManager,_std::default_delete<duckdb::TransactionManager>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::TransactionManager,_std::default_delete<duckdb::TransactionManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::TransactionManager_*,_std::default_delete<duckdb::TransactionManager>_>
  .super__Head_base<0UL,_duckdb::TransactionManager_*,_false>._M_head_impl = this_02._M_head_impl;
  if (_Var3._M_head_impl != (TransactionManager *)0x0) {
    (**(code **)((long)(_Var3._M_head_impl)->_vptr_TransactionManager + 8))();
  }
  (this->super_CatalogEntry).internal = true;
  return;
}

Assistant:

AttachedDatabase::AttachedDatabase(DatabaseInstance &db, AttachedDatabaseType type)
    : CatalogEntry(CatalogType::DATABASE_ENTRY,
                   type == AttachedDatabaseType::SYSTEM_DATABASE ? SYSTEM_CATALOG : TEMP_CATALOG, 0),
      db(db), type(type) {

	// This database does not have storage, or uses temporary_objects for in-memory storage.
	D_ASSERT(type == AttachedDatabaseType::TEMP_DATABASE || type == AttachedDatabaseType::SYSTEM_DATABASE);
	if (type == AttachedDatabaseType::TEMP_DATABASE) {
		storage = make_uniq<SingleFileStorageManager>(*this, string(IN_MEMORY_PATH), false);
	}

	catalog = make_uniq<DuckCatalog>(*this);
	transaction_manager = make_uniq<DuckTransactionManager>(*this);
	internal = true;
}